

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared-validator.cc
# Opt level: O0

Result __thiscall
wabt::SharedValidator::OnCallRef(SharedValidator *this,Location *loc,Index *function_type_index)

{
  bool bVar1;
  Result rhs;
  Var local_c0;
  Enum local_74;
  undefined1 local_70 [8];
  FuncType func_type;
  Index local_30;
  Opcode local_2c;
  Index func_index;
  Index *function_type_index_local;
  Location *loc_local;
  SharedValidator *this_local;
  Result result;
  
  _func_index = function_type_index;
  function_type_index_local = (Index *)loc;
  loc_local = (Location *)this;
  Opcode::Opcode(&local_2c,CallRef);
  this_local._4_4_ = CheckInstr(this,local_2c,(Location *)function_type_index_local);
  func_type._52_4_ = TypeChecker::OnIndexedFuncRef(&this->typechecker_,&local_30);
  Result::operator|=((Result *)((long)&this_local + 4),(Result)func_type._52_4_);
  func_type.type_index = this_local._4_4_;
  bVar1 = Failed(this_local._4_4_);
  if (!bVar1) {
    FuncType::FuncType((FuncType *)local_70);
    Var::Var(&local_c0,local_30,(Location *)function_type_index_local);
    local_74 = (Enum)CheckFuncTypeIndex(this,&local_c0,(FuncType *)local_70);
    Result::operator|=((Result *)((long)&this_local + 4),(Result)local_74);
    Var::~Var(&local_c0);
    rhs = TypeChecker::OnCall(&this->typechecker_,(TypeVector *)local_70,
                              (TypeVector *)
                              &func_type.params.
                               super__Vector_base<wabt::Type,_std::allocator<wabt::Type>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage);
    Result::operator|=((Result *)((long)&this_local + 4),rhs);
    bVar1 = Succeeded(this_local._4_4_);
    if (bVar1) {
      *_func_index = local_30;
    }
    FuncType::~FuncType((FuncType *)local_70);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result SharedValidator::OnCallRef(const Location& loc,
                                  Index* function_type_index) {
  Result result = CheckInstr(Opcode::CallRef, loc);
  Index func_index;
  result |= typechecker_.OnIndexedFuncRef(&func_index);
  if (Failed(result)) {
    return result;
  }
  FuncType func_type;
  result |= CheckFuncTypeIndex(Var(func_index, loc), &func_type);
  result |= typechecker_.OnCall(func_type.params, func_type.results);
  if (Succeeded(result)) {
    *function_type_index = func_index;
  }
  return result;
}